

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O2

int Wlc_StdinProcessSmt(Abc_Frame_t *pAbc,char *pCmd)

{
  int iVar1;
  Vec_Str_t *pVVar2;
  Wlc_Ntk_t *pWVar3;
  void *pvVar4;
  Abc_Cex_t *pCex;
  int level;
  Abc_Frame_t *pAVar5;
  char *pcVar6;
  
  pVVar2 = Wlc_StdinCollectProblem("(check-sat)");
  pWVar3 = Wlc_ReadSmtBuffer("top",pVVar2->pArray,pVVar2->pArray + pVVar2->nSize,0,0);
  Vec_StrFree(pVVar2);
  Wlc_SetNtk(pAbc,pWVar3);
  pAVar5 = pAbc;
  iVar1 = Cmd_CommandExecute(pAbc,pCmd);
  if (iVar1 == 0) {
    iVar1 = Abc_FrameReadProbStatus(pAbc);
    if (iVar1 == -1) {
      pcVar6 = "undecided";
    }
    else {
      iVar1 = Abc_FrameReadProbStatus(pAbc);
      if (iVar1 == 1) {
        pcVar6 = "unsat";
      }
      else {
        iVar1 = Abc_FrameReadProbStatus(pAbc);
        if (iVar1 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                        ,0xd4,"int Wlc_StdinProcessSmt(Abc_Frame_t *, char *)");
        }
        pcVar6 = "sat";
      }
    }
    puts(pcVar6);
    fflush(_stdout);
    while (pVVar2 = Wlc_StdinCollectQuery(), pVVar2 != (Vec_Str_t *)0x0) {
      pcVar6 = strtok(pVVar2->pArray," \n\t\r()");
      iVar1 = strcmp(pcVar6,"get-value");
      level = (int)pcVar6;
      if (iVar1 != 0) {
        pcVar6 = "ABC is expecting \"get-value\" in a follow-up input of the satisfiable problem.\n"
        ;
LAB_001ca2f6:
        Abc_Print(level,pcVar6);
        Vec_StrFree(pVVar2);
        return 0;
      }
      pAVar5 = pAbc;
      iVar1 = Abc_FrameReadProbStatus(pAbc);
      level = (int)pAVar5;
      if (iVar1 != 0) {
        pcVar6 = 
        "ABC received a follow-up input for a problem that is not known to be satisfiable.\n";
        goto LAB_001ca2f6;
      }
      pcVar6 = strtok((char *)0x0,"() \n\t\r");
      pAVar5 = pAbc;
      pvVar4 = Abc_FrameReadCex(pAbc);
      level = (int)pAVar5;
      if (pvVar4 == (void *)0x0) {
        pcVar6 = 
        "ABC does not have a counter-example available to process a \"get-value\" request.\n";
        goto LAB_001ca2f6;
      }
      pWVar3 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
      pCex = (Abc_Cex_t *)Abc_FrameReadCex(pAbc);
      Wlc_NtkReport(pWVar3,pCex,pcVar6,0x10);
      Vec_StrFree(pVVar2);
      fflush(_stdout);
    }
    iVar1 = 1;
  }
  else {
    Abc_Print((int)pAVar5,"Something did not work out with the command \"%s\".\n",pCmd);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Wlc_StdinProcessSmt( Abc_Frame_t * pAbc, char * pCmd )
{
    // collect stdin until (check-sat)
    Vec_Str_t * vInput = Wlc_StdinCollectProblem( "(check-sat)" );
    // parse input
    Wlc_Ntk_t * pNtk = Wlc_ReadSmtBuffer( "top", Vec_StrArray(vInput), Vec_StrArray(vInput) + Vec_StrSize(vInput), 0, 0 );
    Vec_StrFree( vInput );
    // install current network
    Wlc_SetNtk( pAbc, pNtk );
    // execute command
    if ( Cmd_CommandExecute(pAbc, pCmd) )
    {
        Abc_Print( 1, "Something did not work out with the command \"%s\".\n", pCmd );
        return 0;
    }
    // solver finished
    if ( Abc_FrameReadProbStatus(pAbc) == -1 )
        printf( "undecided\n" );
    else if ( Abc_FrameReadProbStatus(pAbc) == 1 )
        printf( "unsat\n" );
    else if ( Abc_FrameReadProbStatus(pAbc) == 0 )
        printf( "sat\n" );
    else assert( 0 );
    fflush( stdout );
    // wait for stdin for give directions
    while ( (vInput = Wlc_StdinCollectQuery()) != NULL )
    {
        char * pName = strtok( Vec_StrArray(vInput), " \n\t\r()" );
        // check directive 
        if ( strcmp(pName, "get-value") )
        {
            Abc_Print( 1, "ABC is expecting \"get-value\" in a follow-up input of the satisfiable problem.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // check status
        if ( Abc_FrameReadProbStatus(pAbc) != 0 )
        {
            Abc_Print( 1, "ABC received a follow-up input for a problem that is not known to be satisfiable.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // get the variable number
        pName = strtok( NULL, "() \n\t\r" );
        // get the counter-example
        if ( Abc_FrameReadCex(pAbc) == NULL )
        {
            Abc_Print( 1, "ABC does not have a counter-example available to process a \"get-value\" request.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // report value of this variable
        Wlc_NtkReport( (Wlc_Ntk_t *)pAbc->pAbcWlc, (Abc_Cex_t *)Abc_FrameReadCex(pAbc), pName, 16 );
        Vec_StrFree( vInput );
        fflush( stdout );
    }
    return 1;
}